

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed-fstream.h
# Opt level: O2

void __thiscall
cnn::compressed_ifstream::compressed_ifstream(compressed_ifstream *this,string *fname)

{
  undefined1 *is;
  bool bVar1;
  long lVar2;
  string suf;
  basic_gzip_decompressor<std::allocator<char>_> local_d8;
  
  std::ios::ios((ios *)&this->field_0x278);
  (this->super_istream)._vptr_basic_istream = (_func_int **)0x35b590;
  *(undefined8 *)&this->field_0x278 = 0x35b5b8;
  std::istream::istream(this,(streambuf *)&PTR_construction_vtable_24__0035b5d0);
  (this->super_istream)._vptr_basic_istream = (_func_int **)0x35b590;
  *(undefined8 *)&this->field_0x278 = 0x35b5b8;
  is = &(this->super_istream).field_0x10;
  std::ifstream::ifstream(is,(fname->_M_dataplus)._M_p,_S_in);
  boost::iostreams::
  filtering_streambuf<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
  ::filtering_streambuf(&this->inbuf);
  lVar2 = std::__cxx11::string::rfind((char)fname,0x2e);
  if (lVar2 - 1U < 0xfffffffffffffffe) {
    std::__cxx11::string::substr((ulong)&suf,(ulong)fname);
    bVar1 = std::operator==(&suf,"gz");
    if (bVar1) {
      boost::iostreams::basic_gzip_decompressor<std::allocator<char>_>::basic_gzip_decompressor
                (&local_d8,0xf,0x1000);
      boost::iostreams::detail::
      chain_client<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>>
      ::push_impl<boost::iostreams::basic_gzip_decompressor<std::allocator<char>>>
                ((chain_client<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>>
                  *)&(this->inbuf).
                     super_chainbuf<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::input,_boost::iostreams::public_>
                     .
                     super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ,&local_d8,-1,-1);
      boost::iostreams::basic_gzip_decompressor<std::allocator<char>_>::~basic_gzip_decompressor
                (&local_d8);
    }
    else {
      bVar1 = std::operator==(&suf,"bz2");
      if (bVar1) {
        boost::iostreams::basic_bzip2_decompressor<std::allocator<char>_>::basic_bzip2_decompressor
                  ((basic_bzip2_decompressor<std::allocator<char>_> *)&local_d8,false,0x1000);
        boost::iostreams::detail::
        chain_client<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>>
        ::push_impl<boost::iostreams::basic_bzip2_decompressor<std::allocator<char>>>
                  ((chain_client<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>>
                    *)&(this->inbuf).
                       super_chainbuf<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::input,_boost::iostreams::public_>
                       .
                       super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ,(basic_bzip2_decompressor<std::allocator<char>_> *)&local_d8,-1,-1);
        boost::detail::shared_count::~shared_count
                  (&local_d8.super_basic_zlib_decompressor<std::allocator<char>_>.
                    super_symmetric_filter<boost::iostreams::detail::zlib_decompressor_impl<std::allocator<char>_>,_std::allocator<char>_>
                    .pimpl_.pn);
      }
    }
    std::__cxx11::string::~string((string *)&suf);
  }
  boost::iostreams::detail::
  chain_client<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>>
  ::push<char,std::char_traits<char>>
            ((chain_client<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>>
              *)&(this->inbuf).
                 super_chainbuf<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::input,_boost::iostreams::public_>
                 .
                 super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ,(basic_istream<char,_std::char_traits<char>_> *)is,-1,-1);
  return;
}

Assistant:

compressed_ifstream(const std::string& fname) : std::istream(&inbuf), file(fname.c_str()) {
    std::size_t pos = fname.rfind('.');
    if (pos != std::string::npos && pos > 0) {
      const std::string suf = fname.substr(pos + 1);
      if (suf == "gz") {
        inbuf.push(boost::iostreams::gzip_decompressor());
      }
      else if (suf == "bz2")
        inbuf.push(boost::iostreams::bzip2_decompressor());
    }
    inbuf.push(file);
  }